

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Coap::Send(Error *__return_storage_ptr__,Coap *this,Message *aMessage)

{
  ErrorCode EVar1;
  Error *pEVar2;
  Endpoint *pEVar3;
  ByteArray data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Message::Serialize((Error *)local_48,aMessage,(ByteArray *)&local_68);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_48 + 8));
  if (EVar1 == kNone) {
    pEVar3 = aMessage->mEndpoint;
    if (pEVar3 == (Endpoint *)0x0) {
      pEVar3 = this->mEndpoint;
      aMessage->mEndpoint = pEVar3;
    }
    (*pEVar3->_vptr_Endpoint[2])(local_48,pEVar3,&local_68,(ulong)aMessage->mSubType);
    Error::operator=(__return_storage_ptr__,(Error *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Error Coap::Send(const Message &aMessage)
{
    Error     error;
    ByteArray data;
    SuccessOrExit(error = aMessage.Serialize(data));

    if (aMessage.GetEndpoint() == nullptr)
    {
        aMessage.SetEndpoint(&mEndpoint);
    }

    error = aMessage.GetEndpoint()->Send(data, aMessage.GetSubType());
    SuccessOrExit(error);

exit:
    return error;
}